

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arxmlStorage.cpp
# Opt level: O0

string * __thiscall
lsp::ShortnameElement::getFullPath_abi_cxx11_(string *__return_storage_ptr__,ShortnameElement *this)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  ShortnameElement *local_18;
  ShortnameElement *this_local;
  
  local_18 = this;
  this_local = (ShortnameElement *)__return_storage_ptr__;
  lVar1 = std::__cxx11::string::length();
  if (lVar1 == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  }
  else {
    std::operator+(&local_38,&this->path,"/");
    std::operator+(__return_storage_ptr__,&local_38,&this->name);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string lsp::ShortnameElement::getFullPath() const
{
    if(path.length())
    {
        return path + "/" + name;
    }
    else
    {
        return name;
    }
}